

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O3

bool bssl::ssl_supports_version(SSL_HANDSHAKE *hs,uint16_t version)

{
  uint16_t *puVar1;
  bool bVar2;
  undefined2 *puVar3;
  long lVar4;
  bool bVar5;
  uint16_t protocol_version;
  ushort local_a;
  
  bVar2 = hs->ssl->method->is_dtls;
  puVar3 = &kTLSVersions;
  if (bVar2 != false) {
    puVar3 = &kDTLSVersions;
  }
  lVar4 = 0;
  do {
    puVar1 = (uint16_t *)((long)puVar3 + lVar4);
    if (*puVar1 == version) break;
    bVar5 = (ulong)(4 - bVar2) * 2 + -2 != lVar4;
    lVar4 = lVar4 + 2;
  } while (bVar5);
  if (((*puVar1 == version) && (bVar2 = ssl_protocol_version_from_wire(&local_a,version), bVar2)) &&
     (hs->min_version <= local_a)) {
    return local_a <= hs->max_version;
  }
  return false;
}

Assistant:

bool ssl_supports_version(const SSL_HANDSHAKE *hs, uint16_t version) {
  const SSL *const ssl = hs->ssl;
  uint16_t protocol_version;
  if (!ssl_method_supports_version(ssl->method, version) ||
      !ssl_protocol_version_from_wire(&protocol_version, version) ||
      hs->min_version > protocol_version ||
      protocol_version > hs->max_version) {
    return false;
  }

  return true;
}